

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O0

void TPZCompElHCurl<pzshape::TPZShapeQuad>::TransformShape
               (TPZFMatrix<double> *phiref,REAL detjac,TPZFMatrix<double> *jacinv,
               TPZFMatrix<double> *axes,TPZFMatrix<double> *phi)

{
  long *in_RDX;
  long *in_RSI;
  TPZFMatrix<double> jacinvt;
  TPZFMatrix<double> axest;
  TPZFMatrix<double> *in_stack_fffffffffffffdc0;
  TPZMatrix<double> *in_stack_fffffffffffffdc8;
  TPZFMatrix<double> *in_stack_fffffffffffffdd0;
  TPZFMatrix<double> *in_stack_fffffffffffffdd8;
  undefined1 local_148 [144];
  undefined1 local_b8 [152];
  long *local_20;
  long *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  TPZFMatrix<double>::TPZFMatrix(in_stack_fffffffffffffdc0);
  TPZFMatrix<double>::TPZFMatrix(in_stack_fffffffffffffdc0);
  (**(code **)(*local_18 + 0x158))(local_18,local_148);
  (**(code **)(*local_20 + 0x158))(local_20,local_b8);
  TPZFMatrix<double>::operator*(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  TPZFMatrix<double>::operator*(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  TPZFMatrix<double>::Transpose(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1bdcc90);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1bdcc98);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1bdcca5);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1bdccb2);
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::TransformShape(const TPZFMatrix<REAL> &phiref,
                                            const REAL detjac,
                                            const TPZFMatrix<REAL> &jacinv,
                                            const TPZFMatrix<REAL> &axes,
                                            TPZFMatrix<REAL> &phi)
{

    //applies covariant piola transform and compute the deformed vectors
    TPZFMatrix<REAL> axest, jacinvt;
    jacinv.Transpose(&jacinvt);
    axes.Transpose(&axest);

    (axest * (jacinvt * phiref)).Transpose(&phi);
}